

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subtract_avx2.c
# Opt level: O0

void subtract32_avx2(int16_t *diff_ptr,uint8_t *src_ptr,uint8_t *pred_ptr)

{
  undefined1 auVar1 [32];
  undefined1 auVar2 [32];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [32];
  undefined1 (*in_RDX) [32];
  undefined1 (*in_RSI) [32];
  undefined8 *in_RDI;
  __m256i diff1;
  __m256i diff0;
  __m256i set_one_minusone;
  __m256i p;
  __m256i s;
  undefined8 local_200;
  undefined8 uStack_1f8;
  undefined8 uStack_1f0;
  undefined8 uStack_1e8;
  undefined8 local_1c0;
  undefined8 uStack_1b8;
  undefined8 uStack_1b0;
  undefined8 uStack_1a8;
  undefined8 uStack_70;
  undefined8 uStack_68;
  
  auVar1 = vlddqu_avx(*in_RSI);
  auVar2 = vlddqu_avx(*in_RDX);
  auVar3 = vpinsrd_avx(ZEXT416(0xff01ff01),0xff01ff01,1);
  auVar3 = vpinsrd_avx(auVar3,0xff01ff01,2);
  auVar3 = vpinsrd_avx(auVar3,0xff01ff01,3);
  auVar4 = vpinsrd_avx(ZEXT416(0xff01ff01),0xff01ff01,1);
  auVar4 = vpinsrd_avx(auVar4,0xff01ff01,2);
  auVar4 = vpinsrd_avx(auVar4,0xff01ff01,3);
  uStack_70 = auVar4._0_8_;
  uStack_68 = auVar4._8_8_;
  auVar5 = vpunpcklbw_avx2(auVar1,auVar2);
  auVar2 = vpunpckhbw_avx2(auVar1,auVar2);
  auVar1._16_8_ = uStack_70;
  auVar1._0_16_ = auVar3;
  auVar1._24_8_ = uStack_68;
  auVar1 = vpmaddubsw_avx2(auVar5,auVar1);
  auVar5._16_8_ = uStack_70;
  auVar5._0_16_ = auVar3;
  auVar5._24_8_ = uStack_68;
  auVar2 = vpmaddubsw_avx2(auVar2,auVar5);
  auVar5 = vperm2i128_avx2(auVar1,auVar2,0x20);
  local_1c0 = auVar5._0_8_;
  uStack_1b8 = auVar5._8_8_;
  uStack_1b0 = auVar5._16_8_;
  uStack_1a8 = auVar5._24_8_;
  *in_RDI = local_1c0;
  in_RDI[1] = uStack_1b8;
  in_RDI[2] = uStack_1b0;
  in_RDI[3] = uStack_1a8;
  auVar1 = vperm2i128_avx2(auVar1,auVar2,0x31);
  local_200 = auVar1._0_8_;
  uStack_1f8 = auVar1._8_8_;
  uStack_1f0 = auVar1._16_8_;
  uStack_1e8 = auVar1._24_8_;
  in_RDI[4] = local_200;
  in_RDI[5] = uStack_1f8;
  in_RDI[6] = uStack_1f0;
  in_RDI[7] = uStack_1e8;
  return;
}

Assistant:

static inline void subtract32_avx2(int16_t *diff_ptr, const uint8_t *src_ptr,
                                   const uint8_t *pred_ptr) {
  __m256i s = _mm256_lddqu_si256((__m256i *)(src_ptr));
  __m256i p = _mm256_lddqu_si256((__m256i *)(pred_ptr));
  __m256i set_one_minusone = _mm256_set1_epi32((int)0xff01ff01);
  __m256i diff0 = _mm256_unpacklo_epi8(s, p);
  __m256i diff1 = _mm256_unpackhi_epi8(s, p);
  diff0 = _mm256_maddubs_epi16(diff0, set_one_minusone);
  diff1 = _mm256_maddubs_epi16(diff1, set_one_minusone);
  _mm256_store_si256((__m256i *)(diff_ptr),
                     _mm256_permute2x128_si256(diff0, diff1, 0x20));
  _mm256_store_si256((__m256i *)(diff_ptr + 16),
                     _mm256_permute2x128_si256(diff0, diff1, 0x31));
}